

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O0

Clause * __thiscall
Saturation::ManCSPassiveClauseContainer::popSelected(ManCSPassiveClauseContainer *this)

{
  Clause *pCVar1;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  __last;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference ppCVar5;
  Clause *t;
  long in_RDI;
  vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_> *this_00;
  Clause *selectedClause;
  uint selectedId;
  string id;
  iterator selectedClauseIt;
  vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_> *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  __first;
  int local_6c;
  string local_30 [32];
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  local_10 [2];
  
  __gnu_cxx::
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  ::__normal_iterator(local_10);
  do {
    std::operator<<((ostream *)&std::cout,"Pick a clause:\n");
    __first._M_current = (Clause **)local_30;
    std::__cxx11::string::string((string *)__first._M_current);
    std::operator>>((istream *)&std::cin,(string *)__first._M_current);
    iVar3 = std::__cxx11::stoi(in_stack_ffffffffffffff40,(size_t *)in_stack_ffffffffffffff38,0);
    this_00 = (vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_> *)(in_RDI + 0x58);
    std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::begin
              (in_stack_ffffffffffffff38);
    std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::end(in_stack_ffffffffffffff38)
    ;
    __last._M_current._4_4_ = iVar3;
    __last._M_current._0_4_ = in_stack_ffffffffffffff60;
    in_stack_ffffffffffffff58 =
         std::
         find_if<__gnu_cxx::__normal_iterator<Kernel::Clause**,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>,Saturation::ManCSPassiveClauseContainer::popSelected()::__0>
                   (__first,__last,in_stack_ffffffffffffff58._M_current);
    local_10[0] = in_stack_ffffffffffffff58;
    std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::end(in_stack_ffffffffffffff38)
    ;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
                        *)in_stack_ffffffffffffff38);
    if (bVar2) {
      local_6c = 3;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"User error: No clause in Passive has id ");
      in_stack_ffffffffffffff40 = (string *)std::operator<<(poVar4,local_30);
      std::operator<<((ostream *)in_stack_ffffffffffffff40,"!\n");
      local_6c = 0;
    }
    std::__cxx11::string::~string(local_30);
  } while (local_6c == 0);
  ppCVar5 = __gnu_cxx::
            __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
            ::operator*(local_10);
  pCVar1 = *ppCVar5;
  t = (Clause *)(in_RDI + 0x58);
  __gnu_cxx::
  __normal_iterator<Kernel::Clause*const*,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>
  ::__normal_iterator<Kernel::Clause**>
            ((__normal_iterator<Kernel::Clause_*const_*,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
              *)in_stack_ffffffffffffff40,
             (__normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
              *)t);
  std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::erase
            (this_00,(const_iterator)in_stack_ffffffffffffff58._M_current);
  Lib::SingleParamEvent<Kernel::Clause_*>::fire
            ((SingleParamEvent<Kernel::Clause_*> *)in_stack_ffffffffffffff40,t);
  return pCVar1;
}

Assistant:

Clause* ManCSPassiveClauseContainer::popSelected()
{
  ASS(!clauses.empty());

  std::vector<Clause*>::iterator selectedClauseIt;
  while(true)
  {
    // ask user to pick a clause id
    std::cout << "Pick a clause:\n";
    std::string id;
    std::cin >> id;
    unsigned selectedId = std::stoi(id);

    // search clause with that id
    selectedClauseIt = std::find_if(clauses.begin(), clauses.end(), 
      [&](Clause* c) -> bool { return c->number() == selectedId; });
    if(selectedClauseIt != clauses.end())
    {
      break;
    }
    else
    {
      std::cout << "User error: No clause in Passive has id " << id << "!\n";
    }
  }

  auto selectedClause	= *selectedClauseIt;
  clauses.erase(selectedClauseIt);
  selectedEvent.fire(selectedClause);

  return selectedClause;
}